

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O0

void __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<float,3,4,0,3,4>>::
resizeLike<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>const,3,4,false>>
          (PlainObjectBase<Eigen::Matrix<float,3,4,0,3,4>> *this,
          EigenBase<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_3,_4,_false>_> *_other)

{
  Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_3,_4,_false> *this_00;
  Index rows;
  Index cols;
  Index othersize;
  Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_3,_4,_false> *other;
  EigenBase<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_3,_4,_false>_> *_other_local;
  PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_> *this_local;
  
  this_00 = EigenBase<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_3,_4,_false>_>::
            derived(_other);
  MapBase<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_3,_4,_false>,_0>::rows
            ((MapBase<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_3,_4,_false>,_0> *)
             this_00);
  MapBase<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_3,_4,_false>,_0>::cols
            ((MapBase<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_3,_4,_false>,_0> *)
             this_00);
  MapBase<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_3,_4,_false>,_0>::rows
            ((MapBase<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_3,_4,_false>,_0> *)
             this_00);
  MapBase<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_3,_4,_false>,_0>::cols
            ((MapBase<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_3,_4,_false>,_0> *)
             this_00);
  rows = MapBase<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_3,_4,_false>,_0>::rows
                   ((MapBase<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_3,_4,_false>,_0>
                     *)this_00);
  cols = MapBase<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_3,_4,_false>,_0>::cols
                   ((MapBase<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_3,_4,_false>,_0>
                     *)this_00);
  PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>::resize
            ((PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_> *)this,rows,cols);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC
    EIGEN_STRONG_INLINE void resizeLike(const EigenBase<OtherDerived>& _other)
    {
      const OtherDerived& other = _other.derived();
      internal::check_rows_cols_for_overflow<MaxSizeAtCompileTime>::run(other.rows(), other.cols());
      const Index othersize = other.rows()*other.cols();
      if(RowsAtCompileTime == 1)
      {
        eigen_assert(other.rows() == 1 || other.cols() == 1);
        resize(1, othersize);
      }
      else if(ColsAtCompileTime == 1)
      {
        eigen_assert(other.rows() == 1 || other.cols() == 1);
        resize(othersize, 1);
      }
      else resize(other.rows(), other.cols());
    }